

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active.cc
# Opt level: O3

void output_and_account_example(vw *all,active *a,example *ec)

{
  double dVar1;
  int *piVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  
  shared_data::update(all->sd,ec->test_only,(bool)(-((ec->l).simple.label != 3.4028235e+38) & 1),
                      ec->loss,ec->weight,ec->num_features);
  fVar4 = (ec->l).simple.label;
  if (((fVar4 != 3.4028235e+38) || (fVar5 = 3.4028235e+38, NAN(fVar4))) &&
     (fVar5 = fVar4, ec->test_only == false)) {
    all->sd->weighted_labels = (double)ec->weight * (double)fVar4 + all->sd->weighted_labels;
    fVar5 = (ec->l).simple.label;
  }
  dVar1 = 0.0;
  if ((fVar5 == 3.4028235e+38) && (dVar1 = 0.0, !NAN(fVar5))) {
    dVar1 = (double)ec->weight;
  }
  all->sd->weighted_unlabeled_examples = dVar1 + all->sd->weighted_unlabeled_examples;
  fVar4 = (ec->l).simple.label;
  if ((fVar4 != 3.4028235e+38) || (NAN(fVar4))) {
    fVar4 = -1.0;
  }
  else {
    fVar4 = query_decision(a,ec->confidence,(float)all->sd->weighted_unlabeled_examples);
  }
  (*all->print)(all->raw_prediction,ec->partial_prediction,-1.0,ec->tag);
  piVar2 = (all->final_prediction_sink)._begin;
  if ((all->final_prediction_sink)._end != piVar2) {
    uVar3 = 0;
    do {
      active_print_result(piVar2[uVar3],(ec->pred).scalar,fVar4,ec->tag);
      uVar3 = uVar3 + 1;
      piVar2 = (all->final_prediction_sink)._begin;
    } while (uVar3 < (ulong)((long)(all->final_prediction_sink)._end - (long)piVar2 >> 2));
  }
  print_update(all,ec);
  return;
}

Assistant:

void output_and_account_example(vw& all, active& a, example& ec)
{
  label_data& ld = ec.l.simple;

  all.sd->update(ec.test_only, ld.label != FLT_MAX, ec.loss, ec.weight, ec.num_features);
  if (ld.label != FLT_MAX && !ec.test_only)
    all.sd->weighted_labels += ((double)ld.label) * ec.weight;
  all.sd->weighted_unlabeled_examples += ld.label == FLT_MAX ? ec.weight : 0;

  float ai = -1;
  if (ld.label == FLT_MAX)
    ai = query_decision(a, ec.confidence, (float)all.sd->weighted_unlabeled_examples);

  all.print(all.raw_prediction, ec.partial_prediction, -1, ec.tag);
  for (size_t i = 0; i < all.final_prediction_sink.size(); i++)
  {
    int f = (int)all.final_prediction_sink[i];
    active_print_result(f, ec.pred.scalar, ai, ec.tag);
  }

  print_update(all, ec);
}